

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::PlyParser::readBytes(PlyParser *this,void *dst,int num)

{
  runtime_error *this_00;
  ulong uVar1;
  
  if (this->format == BINARY_LITTLE_ENDIAN) {
    std::istream::read((char *)this,(long)dst);
    return;
  }
  if (this->format == BINARY_BIG_ENDIAN) {
    if (0 < num) {
      uVar1 = (ulong)(uint)num;
      do {
        std::istream::read((char *)this,(long)dst + (uVar1 - 1));
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"internal error on PLY loader");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void readBytes(void* dst, int num) {
        if (format == BINARY_LITTLE_ENDIAN) fs.read((char*)dst,num);
        else if (format == BINARY_BIG_ENDIAN) for (int i=0; i<num; i++) fs.read((char*)dst+num-i-1,1);
        else throw std::runtime_error("internal error on PLY loader");
      }